

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O0

void learn(stagewise_poly *poly,single_learner *base,example *ec)

{
  example *in_RDX;
  learner<char,_example> *in_RSI;
  long *in_RDI;
  bool training;
  stagewise_poly *in_stack_00000050;
  example *in_stack_ffffffffffffffd8;
  undefined5 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe5;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  
  uVar2 = false;
  if ((*(byte *)(*in_RDI + 0x343a) & 1) != 0) {
    uVar2 = (in_RDX->l).simple.label != 3.4028235e+38;
  }
  in_RDI[0xd28] = (long)in_RDX;
  if ((bool)uVar2 == false) {
    predict((stagewise_poly *)(ulong)CONCAT15(in_stack_ffffffffffffffe5,in_stack_ffffffffffffffe0),
            (single_learner *)in_stack_ffffffffffffffd8,(example *)0x2a4b88);
  }
  else {
    uVar3 = uVar2;
    if ((*(byte *)((long)in_RDI + 0x6964) & 1) != 0) {
      sort_data_update_support(in_stack_00000050);
      *(undefined1 *)((long)in_RDI + 0x6964) = 0;
    }
    synthetic_create((stagewise_poly *)
                     CONCAT17(uVar3,CONCAT16(uVar2,CONCAT15(in_stack_ffffffffffffffe5,
                                                            in_stack_ffffffffffffffe0))),
                     in_stack_ffffffffffffffd8,false);
    LEARNER::learner<char,_example>::learn
              (in_RSI,in_RDX,
               CONCAT17(uVar3,CONCAT16(uVar2,CONCAT15(in_stack_ffffffffffffffe5,
                                                      in_stack_ffffffffffffffe0))));
    in_RDX->partial_prediction = *(float *)(in_RDI + 0xd21);
    in_RDX->updated_prediction = *(float *)((long)in_RDI + 0x690c);
    (in_RDX->pred).scalar = *(float *)(in_RDI + 0xd16);
    if ((((in_RDX->example_counter != 0) && (in_RDI[0xd2a] != in_RDX->example_counter)) &&
        (*(int *)((long)in_RDI + 0xc) != 0)) &&
       ((((*(byte *)(in_RDI + 2) & 1) != 0 &&
         (in_RDX->example_counter % (ulong)*(uint *)(in_RDI + 0xd2c) == 0)) ||
        (((*(byte *)(in_RDI + 2) & 1) == 0 &&
         (in_RDX->example_counter % (ulong)*(uint *)((long)in_RDI + 0xc) == 0)))))) {
      *(int *)(in_RDI + 0xd2c) = (int)in_RDI[0xd2c] << 1;
      bVar1 = true;
      if (*(long *)(*in_RDI + 0x20) != 0) {
        bVar1 = in_RDI[0xd2b] == 1;
      }
      *(bool *)((long)in_RDI + 0x6964) = bVar1;
    }
    in_RDI[0xd2a] = in_RDX->example_counter;
  }
  return;
}

Assistant:

void learn(stagewise_poly &poly, single_learner &base, example &ec)
{
  bool training = poly.all->training && ec.l.simple.label != FLT_MAX;
  poly.original_ec = &ec;

  if (training)
  {
    if (poly.update_support)
    {
      sort_data_update_support(poly);
      poly.update_support = false;
    }

    synthetic_create(poly, ec, training);
    base.learn(poly.synth_ec);
    ec.partial_prediction = poly.synth_ec.partial_prediction;
    ec.updated_prediction = poly.synth_ec.updated_prediction;
    ec.pred.scalar = poly.synth_ec.pred.scalar;

    if (ec.example_counter
        // following line is to avoid repeats when multiple reductions on same example.
        // XXX ideally, would get all "copies" of an example before scheduling the support
        // update, but how do we know?
        && poly.last_example_counter != ec.example_counter && poly.batch_sz &&
        ((poly.batch_sz_double && !(ec.example_counter % poly.next_batch_sz)) ||
            (!poly.batch_sz_double && !(ec.example_counter % poly.batch_sz))))
    {
      poly.next_batch_sz *= 2;  // no effect when !poly.batch_sz_double
      poly.update_support = (poly.all->all_reduce == nullptr || poly.numpasses == 1);
    }
    poly.last_example_counter = ec.example_counter;
  }
  else
    predict(poly, base, ec);
}